

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# speaker_positioning.c
# Opt level: O2

int mixed_compute_gains(float *position,float *gains,mixed_channel_t *speakers,
                       mixed_channel_t *count,vbap_data *data)

{
  byte bVar1;
  float fVar2;
  float fVar3;
  byte bVar4;
  ulong uVar5;
  float *pfVar6;
  byte bVar7;
  ulong uVar8;
  byte bVar9;
  float *pfVar10;
  int j;
  ulong uVar11;
  int iVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [64];
  float gain [3];
  float direction [3];
  undefined8 local_48;
  float local_40;
  float local_3c;
  float local_38;
  float local_34;
  
  bVar1 = data->dims;
  vec_normalize(&local_3c,position);
  if ((((local_3c == 0.0) && (local_38 == 0.0)) && (!NAN(local_38))) &&
     ((local_34 == 0.0 && (!NAN(local_34))))) {
    if (bVar1 == 3) {
      local_38 = -1.0;
    }
    else {
      local_34 = 1.0;
    }
  }
  fVar3 = local_34;
  uVar5 = 0;
  bVar4 = bVar1;
  if ((char)bVar1 < '\x01') {
    bVar4 = 0;
  }
  pfVar6 = data->sets[0].inv_mat + 2;
  auVar14 = ZEXT464(0xff800000);
  uVar8 = 0;
  bVar7 = bVar1;
  for (; (long)uVar5 < (long)data->set_count; uVar5 = uVar5 + 1) {
    local_40 = 0.0;
    local_48 = 0;
    auVar13 = SUB6416(ZEXT464(0x7f800000),0);
    pfVar10 = pfVar6;
    bVar9 = bVar1;
    for (uVar11 = 0; bVar4 != uVar11; uVar11 = uVar11 + 1) {
      fVar2 = fVar3 * *pfVar10 + local_3c * pfVar10[-2] + local_38 * pfVar10[-1];
      *(float *)((long)&local_48 + uVar11 * 4) = fVar2;
      auVar13 = vminss_avx(ZEXT416((uint)fVar2),auVar13);
      bVar9 = (bVar9 - 1) + (fVar2 < -0.01);
      pfVar10 = pfVar10 + 3;
    }
    if ((auVar14._0_4_ < auVar13._0_4_) && ((char)bVar9 <= (char)bVar7)) {
      gains[2] = local_40;
      *(undefined8 *)gains = local_48;
      auVar14 = ZEXT1664(auVar13);
      uVar8 = uVar5 & 0xffffffff;
      bVar7 = bVar9;
    }
    pfVar6 = pfVar6 + 10;
  }
  speakers[2] = data->sets[uVar8 & 0xff].speakers[2];
  *(undefined2 *)speakers = *(undefined2 *)data->sets[uVar8 & 0xff].speakers;
  iVar12 = 1;
  for (uVar5 = 0; bVar4 != uVar5; uVar5 = uVar5 + 1) {
    if (gains[uVar5] < -0.01) {
      gains[uVar5] = 0.0001;
      iVar12 = 0;
    }
  }
  vec_normalize(gains,gains);
  *count = bVar1;
  return iVar12;
}

Assistant:

VECTORIZE int mixed_compute_gains(const float position[3], float gains[], mixed_channel_t speakers[], mixed_channel_t *count, struct vbap_data *data){
  char dims = data->dims;
  float best_gain = -INFINITY;
  char best_negs = dims;
  mixed_channel_t best_set = 0;
  
  // If the direction is a zero vector, recast as 0,-1,0 on 3d, and 0,0,1 on 2d.
  // which should give a best approximation for being "on" the position.
  // Ideally we'd drive *all* speakers in that case, but the exact power of them
  // isn't clear to me.
  float direction[3];
  vec_normalize(direction, position);
  if(direction[0] == 0.0 && direction[1] == 0.0 && direction[2] == 0.0){
    if(dims == 3) direction[1] = -1.0;
    else          direction[2] = +1.0;
  }
  // Find set with the highest correspondence to our direction
  for(int i=0; i<data->set_count; ++i){
    float gain[3] = {0.0, 0.0, 0.0};
    float cur_gain = INFINITY;
    char cur_negs = dims;
    
    for(int j=0; j<dims; ++j){
      gain[j] = direction[0] * data->sets[i].inv_mat[0+j*3] +
                direction[1] * data->sets[i].inv_mat[1+j*3] +
                direction[2] * data->sets[i].inv_mat[2+j*3];
      if(gain[j] < cur_gain)
        cur_gain = gain[j];
      if(-0.01 <= gain[j])
        cur_negs--;
    }
    if(best_gain < cur_gain && cur_negs <= best_negs){
      best_gain = cur_gain;
      best_negs = cur_negs;
      best_set = i;
      memcpy(gains, gain, sizeof(float)*3);
    }
  }
  memcpy(speakers, data->sets[best_set].speakers, sizeof(mixed_channel_t)*3);
  // Handle if the best set still does not contain our point.
  char okey = 1;
  for(int i=0; i<dims; ++i){
    if(gains[i] < -0.01){
      gains[i] = 0.0001;
      okey = 0;
    }
  }
  vec_normalize(gains, gains);
  *count = dims;
  return okey;
}